

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

void CP_TimestepMetadataHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  pthread_mutex_t *__mutex;
  SstStream s;
  size_t sVar1;
  void *__ptr;
  CMConnection conn_00;
  
  if (_perfstubs_initialized == 1) {
    if (CP_TimestepMetadataHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_reader.c"
                                          ,"CP_TimestepMetadataHandler",0x3b2);
      CP_TimestepMetadataHandler::timer = (void *)ps_timer_create_(__ptr);
      free(__ptr);
    }
    ps_timer_start_(CP_TimestepMetadataHandler::timer);
  }
  s = *Msg_v;
  __mutex = &s->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((s->Rank != 0) || (s->WriterConfigParams->CPCommPattern == 1)) {
    if (*(long *)((long)Msg_v + 0x20) == 0) {
      CP_verbose(s,PerRankVerbose,"Received a message that timestep %ld has been discarded\n",
                 *(undefined8 *)((long)Msg_v + 8));
      sVar1 = s->WriterConfigParams->MarshalMethod;
      if (sVar1 == 2) {
        AddFormatsToMetaMetaInfo(s,(_TimestepMetadataMsg *)Msg_v);
        AddAttributesToAttrDataList(s,(_TimestepMetadataMsg *)Msg_v);
      }
      else if (sVar1 == 0) {
        FFSMarshalInstallPreciousMetadata(s,(TSMetadataMsg)Msg_v);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    CP_verbose(s,PerStepVerbose,"Received an incoming metadata message for timestep %ld\n",
               *(undefined8 *)((long)Msg_v + 8));
  }
  CMtake_buffer(cm,Msg_v);
  queueTimestepMetadataMsgAndNotify(s,(_TimestepMetadataMsg *)Msg_v,conn_00);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_TimestepMetadataHandler::timer);
    return;
  }
  return;
}

Assistant:

void CP_TimestepMetadataHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                                attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream;
    struct _TimestepMetadataMsg *Msg = (struct _TimestepMetadataMsg *)Msg_v;
    Stream = (SstStream)Msg->RS_Stream;
    STREAM_MUTEX_LOCK(Stream);
    if ((Stream->Rank != 0) || (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer))
    {
        /* All ranks are getting this */
        if (Msg->Metadata == NULL)
        {
            CP_verbose(Stream, PerRankVerbose,
                       "Received a message that timestep %ld has been discarded\n", Msg->Timestep);

            /*
             * before discarding, install any precious metadata from this
             * message
             */
            if (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS)
            {
                FFSMarshalInstallPreciousMetadata(Stream, Msg);
            }
            else if (Stream->WriterConfigParams->MarshalMethod == SstMarshalBP5)
            {
                AddFormatsToMetaMetaInfo(Stream, Msg);
                AddAttributesToAttrDataList(Stream, Msg);
            }
            STREAM_MUTEX_UNLOCK(Stream);

            return;
        }
        else
        {
            CP_verbose(Stream, PerStepVerbose,
                       "Received an incoming metadata message for timestep %ld\n", Msg->Timestep);
        }
        /* arrange for this message data to stay around */
        CMtake_buffer(cm, Msg);

        queueTimestepMetadataMsgAndNotify(Stream, Msg, conn);
    }
    else
    {
        /* I must be rank 0 and only I got this, I'll need to distribute it to
         * everyone */
        /* arrange for this message data to stay around */
        CMtake_buffer(cm, Msg);

        queueTimestepMetadataMsgAndNotify(Stream, Msg, conn);
    }
    STREAM_MUTEX_UNLOCK(Stream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}